

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

void Curl_getoff_all_pipelines(Curl_easy *data,connectdata *conn)

{
  _Bool _Var1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  
  bVar3 = true;
  bVar4 = true;
  if (conn->readchannel_inuse == true) {
    _Var1 = Curl_recvpipe_head(data,conn);
    bVar4 = !_Var1;
  }
  if (conn->writechannel_inuse == true) {
    _Var1 = Curl_sendpipe_head(data,conn);
    bVar3 = !_Var1;
  }
  iVar2 = Curl_removeHandleFromPipeline(data,conn->recv_pipe);
  if (!(bool)(iVar2 == 0 | bVar4)) {
    Curl_pipeline_leave_read(conn);
  }
  iVar2 = Curl_removeHandleFromPipeline(data,conn->send_pipe);
  if ((bool)(iVar2 == 0 | bVar3)) {
    return;
  }
  Curl_pipeline_leave_write(conn);
  return;
}

Assistant:

void Curl_getoff_all_pipelines(struct Curl_easy *data,
                               struct connectdata *conn)
{
  bool recv_head = (conn->readchannel_inuse &&
                    Curl_recvpipe_head(data, conn));
  bool send_head = (conn->writechannel_inuse &&
                    Curl_sendpipe_head(data, conn));

  if(Curl_removeHandleFromPipeline(data, conn->recv_pipe) && recv_head)
    Curl_pipeline_leave_read(conn);
  if(Curl_removeHandleFromPipeline(data, conn->send_pipe) && send_head)
    Curl_pipeline_leave_write(conn);
}